

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O3

void output_example(vw *all,bs *d,example *ec)

{
  double dVar1;
  double *pdVar2;
  int *piVar3;
  double *pdVar4;
  int *piVar5;
  float fVar6;
  float fVar7;
  
  shared_data::update(all->sd,ec->test_only,(bool)(-((ec->l).simple.label != 3.4028235e+38) & 1),
                      ec->loss,ec->weight,ec->num_features);
  fVar7 = 3.4028235e+38;
  fVar6 = (ec->l).simple.label;
  if (((fVar6 != 3.4028235e+38) || (NAN(fVar6))) && (ec->test_only == false)) {
    all->sd->weighted_labels = (double)ec->weight * (double)fVar6 + all->sd->weighted_labels;
  }
  if ((all->final_prediction_sink)._end != (all->final_prediction_sink)._begin) {
    d->lb = 3.4028235e+38;
    d->ub = -3.4028235e+38;
    pdVar4 = (d->pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (d->pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar4 != pdVar2) {
      fVar6 = -3.4028235e+38;
      do {
        dVar1 = *pdVar4;
        if ((double)fVar6 < dVar1) {
          fVar6 = (float)dVar1;
          d->ub = fVar6;
        }
        if (dVar1 < (double)fVar7) {
          fVar7 = (float)dVar1;
          d->lb = fVar7;
        }
        pdVar4 = pdVar4 + 1;
      } while (pdVar4 != pdVar2);
    }
  }
  piVar5 = (all->final_prediction_sink)._begin;
  piVar3 = (all->final_prediction_sink)._end;
  if (piVar5 != piVar3) {
    do {
      print_result(*piVar5,(ec->pred).scalar,ec->tag,d->lb,d->ub);
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar3);
  }
  print_update(all,ec);
  return;
}

Assistant:

void output_example(vw& all, bs& d, example& ec)
{
  label_data& ld = ec.l.simple;

  all.sd->update(ec.test_only, ld.label != FLT_MAX, ec.loss, ec.weight, ec.num_features);
  if (ld.label != FLT_MAX && !ec.test_only)
    all.sd->weighted_labels += ((double)ld.label) * ec.weight;

  if (all.final_prediction_sink.size() != 0)  // get confidence interval only when printing out predictions
  {
    d.lb = FLT_MAX;
    d.ub = -FLT_MAX;
    for (double v : *d.pred_vec)
    {
      if (v > d.ub)
        d.ub = (float)v;
      if (v < d.lb)
        d.lb = (float)v;
    }
  }

  for (int sink : all.final_prediction_sink) print_result(sink, ec.pred.scalar, ec.tag, d.lb, d.ub);

  print_update(all, ec);
}